

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primvar.hh
# Opt level: O0

optional<std::vector<bool,_std::allocator<bool>_>_> * __thiscall
tinyusdz::primvar::PrimVar::get_default_value<std::vector<bool,std::allocator<bool>>>
          (optional<std::vector<bool,_std::allocator<bool>_>_> *__return_storage_ptr__,PrimVar *this
          )

{
  optional<std::vector<bool,_std::allocator<bool>_>_> local_48;
  PrimVar *local_18;
  PrimVar *this_local;
  
  local_18 = this;
  this_local = (PrimVar *)__return_storage_ptr__;
  get_value<std::vector<bool,std::allocator<bool>>>(&local_48,this);
  nonstd::optional_lite::optional<std::vector<bool,_std::allocator<bool>_>_>::
  optional<std::vector<bool,_std::allocator<bool>_>,_0>(__return_storage_ptr__,&local_48);
  nonstd::optional_lite::optional<std::vector<bool,_std::allocator<bool>_>_>::~optional(&local_48);
  return __return_storage_ptr__;
}

Assistant:

nonstd::optional<T> get_default_value() const {
    return get_value<T>();
  }